

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef __thiscall llvm::sys::path::extension(path *this,StringRef path,Style style)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  StringRef SVar6;
  undefined1 local_40 [8];
  reverse_iterator I;
  
  I.Path.Data = path.Data;
  I.Path.Length = 0;
  I.Component.Data = (char *)0x0;
  I.Position._0_4_ = (undefined4)path.Length;
  local_40 = (undefined1  [8])this;
  I.Component.Length = (size_t)I.Path.Data;
  reverse_iterator::operator++((reverse_iterator *)local_40);
  lVar5 = 0;
  do {
    if (I.Component.Data + lVar5 == (char *)0x0) goto LAB_00d9aea7;
    lVar1 = lVar5 + -1;
    lVar2 = lVar5 + (I.Path.Length - 1);
    lVar5 = lVar1;
  } while (I.Component.Data[lVar2] != '.');
  if (I.Component.Data == (char *)0x2) {
    if (*(short *)I.Path.Length == 0x2e2e) {
LAB_00d9aea7:
      sVar4 = 0;
      pcVar3 = (char *)0x0;
      goto LAB_00d9aea9;
    }
  }
  else if (I.Component.Data == (char *)0x1) {
    sVar4 = 0;
    pcVar3 = (char *)0x0;
    if (*(char *)I.Path.Length == '.') goto LAB_00d9aea9;
  }
  pcVar3 = I.Component.Data + lVar1 + I.Path.Length;
  sVar4 = -lVar1;
LAB_00d9aea9:
  SVar6.Length = sVar4;
  SVar6.Data = pcVar3;
  return SVar6;
}

Assistant:

StringRef extension(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return StringRef();
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return StringRef();
    else
      return fname.substr(pos);
}